

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  FILE *f;
  Int32 IVar1;
  uint uVar2;
  optional<n_e_s::core::Pixel> oVar3;
  ImGuiIO *pIVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  Time dt;
  INesController *pIVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  uint uVar8;
  long lVar9;
  int __fd;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  aVar10;
  bool bVar11;
  string_view format_str;
  format_args args;
  string_view format_str_00;
  string_view format_str_01;
  format_args args_00;
  format_args args_01;
  PpuHelper ppu_helper;
  Control control;
  Time frame_time;
  Clock delta_clock;
  Screen screen;
  SimpleRenderer simple_renderer;
  Nes nes;
  ifstream fs;
  RenderWindow window;
  Gui gui;
  PpuHelper local_5630;
  Control local_5628;
  Time local_5618 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5608;
  VideoMode local_55e8;
  Screen local_55d8;
  SimpleRenderer local_5588;
  Nes local_5578;
  string local_5528;
  uint auStack_5508 [124];
  RenderWindow local_5318;
  undefined1 local_5108 [48];
  PpuWidget local_50d8;
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  
  sf::VideoMode::VideoMode(&local_55e8,0x500,0x3c0,0x20);
  std::locale::locale((locale *)&local_55d8);
  sf::String::String((String *)local_5108,"n_e_s visulization",(locale *)&local_55d8);
  local_5528._M_dataplus._M_p = (char *)0x0;
  local_5528._M_string_length = 0x100000000;
  local_5528.field_2._M_allocated_capacity = 1;
  local_5528.field_2._8_8_ = local_5528.field_2._8_8_ & 0xffffffffffffff00;
  sf::RenderWindow::RenderWindow
            (&local_5318,local_55e8,(String *)local_5108,7,(ContextSettings *)&local_5528);
  if ((undefined1 *)local_5108._0_8_ != local_5108 + 0x10) {
    operator_delete((void *)local_5108._0_8_,local_5108._16_8_ * 4 + 4);
  }
  std::locale::~locale((locale *)&local_55d8);
  sf::Window::setFramerateLimit(&local_5318.super_Window,0x14);
  ImGui::SFML::Init(&local_5318,true);
  pIVar4 = ImGui::GetIO();
  *(byte *)&pIVar4->ConfigFlags = (byte)pIVar4->ConfigFlags | 0x40;
  pIVar4->ConfigDockingNoSplit = true;
  nesvis::Screen::Screen(&local_55d8,0x100,0xf0,3.0);
  n_e_s::nes::Nes::Nes(&local_5578);
  local_5628.is_running_ = true;
  local_5628.use_simple_renderer_ = false;
  local_5628.nes_ = &local_5578;
  nesvis::PpuHelper::PpuHelper(&local_5630,&local_5578);
  nesvis::Gui::Gui((Gui *)local_5108,&local_5578,&local_5630,&local_5628);
  nesvis::SimpleRenderer::SimpleRenderer(&local_5588,&local_5578,&local_5630);
  if (1 < argc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5608,argv[1],(allocator<char> *)local_5618);
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_5608,0,0,"Loading rom from: ",0x12);
    local_5528._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
    paVar7 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5528._M_dataplus._M_p == paVar7) {
      local_5528.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_5528.field_2._8_8_ = *(ulong *)((long)&pbVar5->field_2 + 8);
      local_5528._M_dataplus._M_p = (pointer)&local_5528.field_2;
    }
    else {
      local_5528.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    }
    local_5528._M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
    nesvis::LogWidget::add((LogWidget *)local_5108,&local_5528);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5528._M_dataplus._M_p != &local_5528.field_2) {
      operator_delete(local_5528._M_dataplus._M_p,local_5528.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5608._M_dataplus._M_p != &local_5608.field_2) {
      operator_delete(local_5608._M_dataplus._M_p,local_5608.field_2._M_allocated_capacity + 1);
    }
    local_5528._M_dataplus._M_p = argv[1];
    format_str.size_ = 0x15;
    format_str.data_ = "Loading rom from: {}\n";
    args.field_1.values_ =
         (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_5528;
    args.desc_ = 0xc;
    fmt::v8::vprint(format_str,args);
    std::ifstream::ifstream(&local_5528,argv[1],_S_bin);
    uVar2 = *(uint *)((long)auStack_5508 + *(long *)(local_5528._M_dataplus._M_p + -0x18));
    bVar11 = (uVar2 & 5) == 0;
    if (bVar11) {
      n_e_s::nes::Nes::load_rom(&local_5578,(istream *)&local_5528);
    }
    else {
      local_5618[0].m_microseconds = (Int64)argv[1];
      format_str_00.size_ = 0x18;
      format_str_00.data_ = "Could not load file: {}\n";
      args_00.field_1.values_ =
           (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)local_5618;
      args_00.desc_ = 0xc;
      fmt::v8::vprint(_stderr,format_str_00,args_00);
    }
    uVar8 = (uint)!bVar11;
    std::ifstream::~ifstream(&local_5528);
    if ((uVar2 & 5) != 0) goto LAB_0010fa7a;
  }
  nesvis::PpuWidget::load_pattern_tables(&local_50d8);
  sf::Clock::Clock((Clock *)&local_5608);
  while( true ) {
    bVar11 = sf::Window::isOpen(&local_5318.super_Window);
    if (!bVar11) break;
    aVar10.values_ = (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_5528;
    bVar11 = sf::Window::pollEvent(&local_5318.super_Window,(Event *)&local_5528);
    while (__fd = aVar10._0_4_, bVar11 != false) {
      ImGui::SFML::ProcessEvent((Event *)&local_5528);
      if ((int)local_5528._M_dataplus._M_p == 0) {
        sf::Window::close(&local_5318.super_Window,__fd);
      }
      aVar10.values_ = (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_5528
      ;
      bVar11 = sf::Window::pollEvent(&local_5318.super_Window,(Event *)&local_5528);
    }
    dt = sf::Clock::restart((Clock *)&local_5608);
    ImGui::SFML::Update(&local_5318,dt);
    pIVar6 = n_e_s::nes::Nes::controller1(&local_5578);
    pIVar4 = ImGui::GetIO();
    if (pIVar4->WantCaptureKeyboard == false) {
      bVar11 = sf::Keyboard::isKeyPressed(A);
      (*pIVar6->_vptr_INesController[2])(pIVar6,0,(ulong)bVar11);
      bVar11 = sf::Keyboard::isKeyPressed(S);
      (*pIVar6->_vptr_INesController[2])(pIVar6,1,(ulong)bVar11);
      bVar11 = sf::Keyboard::isKeyPressed(Left);
      (*pIVar6->_vptr_INesController[2])(pIVar6,6,(ulong)bVar11);
      bVar11 = sf::Keyboard::isKeyPressed(Right);
      (*pIVar6->_vptr_INesController[2])(pIVar6,7,(ulong)bVar11);
      bVar11 = sf::Keyboard::isKeyPressed(Up);
      (*pIVar6->_vptr_INesController[2])(pIVar6,4,(ulong)bVar11);
      bVar11 = sf::Keyboard::isKeyPressed(Down);
      (*pIVar6->_vptr_INesController[2])(pIVar6,5,(ulong)bVar11);
      bVar11 = sf::Keyboard::isKeyPressed(Q);
      (*pIVar6->_vptr_INesController[2])(pIVar6,3,(ulong)bVar11);
      bVar11 = sf::Keyboard::isKeyPressed(W);
      (*pIVar6->_vptr_INesController[2])(pIVar6,2,(ulong)bVar11);
    }
    sf::Color::Color((Color *)&local_5528,'\0','\0','\0',0xff);
    sf::RenderTarget::clear(&local_5318.super_RenderTarget,(Color *)&local_5528);
    if (local_5628.is_running_ == true) {
      lVar9 = 0x1062c7;
      do {
        oVar3 = n_e_s::nes::Nes::execute(&local_5578);
        if ((((uint6)oVar3.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
                     super__Optional_payload_base<n_e_s::core::Pixel> & 0x10000000000) != 0) &&
           (local_5628.use_simple_renderer_ == false)) {
          sf::Color::Color((Color *)&local_5528,
                           oVar3.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
                           super__Optional_payload_base<n_e_s::core::Pixel>._M_payload._2_1_,
                           oVar3.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
                           super__Optional_payload_base<n_e_s::core::Pixel>._M_payload._3_1_,
                           oVar3.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
                           super__Optional_payload_base<n_e_s::core::Pixel>._M_payload._4_1_,0xff);
          nesvis::Screen::set_pixel
                    (&local_55d8,
                     oVar3.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
                     super__Optional_payload_base<n_e_s::core::Pixel>._M_payload._0_4_ & 0xff,
                     oVar3.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
                     super__Optional_payload_base<n_e_s::core::Pixel>._M_payload._0_4_ >> 8 & 0xff,
                     (Color *)&local_5528);
        }
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    if (local_5628.use_simple_renderer_ == true) {
      nesvis::SimpleRenderer::render(&local_5588,&local_55d8);
    }
    nesvis::Gui::draw((Gui *)local_5108);
    nesvis::Screen::draw(&local_55d8,&local_5318);
    ImGui::SFML::Render(&local_5318);
    sf::Window::display(&local_5318.super_Window);
    local_5618[0] = dt;
    IVar1 = sf::Time::asMilliseconds(local_5618);
    f = _stderr;
    if (0x32 < IVar1) {
      uVar2 = sf::Time::asMilliseconds(local_5618);
      local_5528._M_dataplus._M_p = (pointer)(ulong)uVar2;
      local_5528.field_2._M_allocated_capacity = 0x32;
      format_str_01.size_ = 0x27;
      format_str_01.data_ = "Things are running slowly: {}ms - {}ms\n";
      args_01.field_1.values_ =
           (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_5528;
      args_01.desc_ = 0x11;
      fmt::v8::vprint(f,format_str_01,args_01);
    }
  }
  ImGui::SFML::Shutdown();
  uVar8 = 0;
LAB_0010fa7a:
  std::
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_68);
  std::
  _Rb_tree<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_p != &local_b0) {
    operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
  }
  lVar9 = 0x5018;
  do {
    sf::Texture::~Texture((Texture *)(local_5108 + lVar9));
    lVar9 = lVar9 + -0x28;
  } while (lVar9 != 0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_5108);
  n_e_s::nes::Nes::~Nes(&local_5578);
  sf::Image::~Image(&local_55d8.image_);
  sf::Texture::~Texture(&local_55d8.texture_);
  sf::RenderWindow::~RenderWindow(&local_5318);
  return uVar8;
}

Assistant:

int main(int argc, char **argv) {
    sf::RenderWindow window(
            sf::VideoMode(kWinWidth, kWinHeight), "n_e_s visulization");
    constexpr int kFps = 20;
    window.setFramerateLimit(kFps);

    ImGui::SFML::Init(window);
    ImGuiIO &io = ImGui::GetIO();
    // NOLINTNEXTLINE(hicpp-signed-bitwise)
    io.ConfigFlags |= ImGuiConfigFlags_DockingEnable;
    io.ConfigDockingNoSplit = true;

    nesvis::Screen screen(kNesWidth, kNesHeight, kNesScaleFactor);
    n_e_s::nes::Nes nes;
    nesvis::Control control(&nes);
    nesvis::PpuHelper ppu_helper(&nes);
    nesvis::Gui gui(&nes, &ppu_helper, &control);

    nesvis::SimpleRenderer simple_renderer(&nes, &ppu_helper);

    try {
        if (argc > 1) {
            gui.log_widget.add("Loading rom from: " + std::string(argv[1]));
            fmt::print("Loading rom from: {}\n", argv[1]);
            std::ifstream fs(argv[1], std::ios::binary);
            if (!fs) {
                fmt::print(stderr, "Could not load file: {}\n", argv[1]);
                return 1;
            }
            nes.load_rom(fs);
        }

        gui.ppu_widget.load_pattern_tables();

        sf::Clock delta_clock;
        while (window.isOpen()) {
            poll_events(window);

            const sf::Time delta_time = delta_clock.restart();
            ImGui::SFML::Update(window, delta_time);

            handle_keys(nes.controller1());

            window.clear();

            // robinlinden/desunes
            constexpr size_t kMasterClock = 21'477'272; // Hz
            // Tick rates:
            // CPU: every 12 master ticks
            // PPU: every 4
            // APU: every 24
            constexpr size_t kNESClock = kMasterClock;
            constexpr size_t kTickPerFrame = kNESClock / kFps;
            if (control.is_running()) {
                for (size_t i = 0; i < kTickPerFrame; ++i) {
                    const auto pixel = nes.execute();
                    if (pixel && !control.use_simple_renderer()) {
                        const auto color = pixel->color;
                        screen.set_pixel(pixel->x,
                                pixel->y,
                                sf::Color(color.r, color.g, color.b));
                    }
                }
            }

            if (control.use_simple_renderer()) {
                simple_renderer.render(&screen);
            }

            gui.draw();
            screen.draw(window);

            ImGui::SFML::Render(window);
            window.display();

            const auto frame_time = delta_time;
            if (frame_time.asMilliseconds() > 1000 / kFps) {
                fmt::print(stderr,
                        "Things are running slowly: {}ms - {}ms\n",
                        frame_time.asMilliseconds(),
                        1000 / kFps);
            }
        }

        ImGui::SFML::Shutdown();
    } catch (const std::exception &e) {
        fmt::print(stderr, "Caught exception: {}\n", e.what());
    }

    return 0;
}